

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O0

int free_form(FORM *form)

{
  int *piVar1;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
    form_local._4_4_ = -2;
  }
  else if ((form->status & 1) == 0) {
    Disconnect_Fields(form);
    if (form->page != (_PAGE *)0x0) {
      free(form->page);
    }
    free(form);
    piVar1 = __errno_location();
    *piVar1 = 0;
    form_local._4_4_ = 0;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = -3;
    form_local._4_4_ = -3;
  }
  return form_local._4_4_;
}

Assistant:

int free_form(FORM * form)
{
  if ( !form )	
    RETURN(E_BAD_ARGUMENT);

  if ( form->status & _POSTED)  
    RETURN(E_POSTED);
  
  Disconnect_Fields( form );
  if (form->page) 
    free(form->page);
  free(form);
  
  RETURN(E_OK);
}